

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.cxx
# Opt level: O2

string * cmRemoveQuotes_abi_cxx11_(string *__return_storage_ptr__,string_view str)

{
  allocator<char> local_19;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  local_18._M_str = str._M_str;
  local_18._M_len = str._M_len;
  if (((1 < local_18._M_len) && (*local_18._M_str == '\"')) &&
     (local_18._M_str[local_18._M_len - 1] == '\"')) {
    local_18._M_str = local_18._M_str + 1;
    local_18._M_len = local_18._M_len - 2;
  }
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)__return_storage_ptr__,&local_18,&local_19);
  return __return_storage_ptr__;
}

Assistant:

std::string cmRemoveQuotes(cm::string_view str)
{
  // We process only strings that have two quotes at least.
  // Also front() and back() are only defined behavior on non empty strings.
  if (str.size() >= 2 &&    //
      str.front() == '"' && //
      str.back() == '"') {
    // Remove a quote from the front and back
    str.remove_prefix(1);
    str.remove_suffix(1);
  }
  return std::string(str);
}